

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.cpp
# Opt level: O0

void __thiscall ftxui::anon_unknown_4::Size::SetBox(Size *this,Box box)

{
  int *piVar1;
  __shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  int local_38;
  int local_34;
  Size *local_30;
  undefined1 local_28 [16];
  Size *this_local;
  Box box_local;
  
  local_28._0_8_ = box._8_8_;
  local_30 = box._0_8_;
  local_28._8_8_ = this;
  this_local = local_30;
  box_local._0_8_ = local_28._0_8_;
  Node::SetBox(&this->super_Node,box);
  if (*(int *)&(this->super_Node).field_0x5c == 0) {
    if (this->constraint_ < GREATER_THAN) {
      local_34 = (int)this_local + this->value_ + 1;
      piVar1 = std::min<int>(&local_34,(int *)((long)&this_local + 4));
      this_local = (Size *)CONCAT44(*piVar1,(int)this_local);
    }
  }
  else if (this->constraint_ < GREATER_THAN) {
    local_38 = box_local.x_min + this->value_ + 1;
    piVar1 = std::min<int>(&local_38,&box_local.x_max);
    box_local.x_max = *piVar1;
  }
  this_00 = (__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
            operator[](&(this->super_Node).children_,0);
  peVar2 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(this_00);
  (*peVar2->_vptr_Node[3])(peVar2,this_local,box_local._0_8_);
  return;
}

Assistant:

void SetBox(Box box) override {
    Node::SetBox(box);

    if (direction_ == WIDTH) {
      switch (constraint_) {
        case LESS_THAN:
        case EQUAL:
          box.x_max = std::min(box.x_min + value_ + 1, box.x_max);
          break;
        case GREATER_THAN:
          break;
      }
    } else {
      switch (constraint_) {
        case LESS_THAN:
        case EQUAL:
          box.y_max = std::min(box.y_min + value_ + 1, box.y_max);
          break;
        case GREATER_THAN:
          break;
      }
    }
    children_[0]->SetBox(box);
  }